

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O3

void anon_unknown.dwarf_3a15::modtest(int base,int test)

{
  ulong byteCount;
  bool bVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  clock_t cVar5;
  clock_t cVar6;
  pointer pBVar7;
  undefined4 in_register_0000003c;
  pointer pBVar8;
  pointer pBVar9;
  vector<BN,_std::allocator<BN>_> g;
  BN m;
  vector<BN,_std::allocator<BN>_> mod;
  vector<BN,_std::allocator<BN>_> exp;
  vector<BN,_std::allocator<BN>_> local_138;
  undefined8 local_118;
  BN local_110;
  vector<BN,_std::allocator<BN>_> local_f8;
  vector<BN,_std::allocator<BN>_> local_d8;
  BN local_c0;
  BN local_a8;
  BN local_90;
  BN local_78;
  BN local_60;
  BN local_48;
  
  local_118 = CONCAT44(in_register_0000003c,base);
  local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (BN *)0x0;
  local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar2 = 0;
  local_f8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_start =
       (BN *)0x0;
  local_f8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (test < 1) {
LAB_00109a0b:
    cVar3 = clock();
    if (local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pBVar7 = local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pBVar8 = local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
               ._M_start;
      pBVar9 = local_f8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start;
      do {
        BN::PowMod(&local_60,pBVar8,pBVar7,pBVar9);
        if (local_60.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        pBVar8 = pBVar8 + 1;
        pBVar7 = pBVar7 + 1;
        pBVar9 = pBVar9 + 1;
      } while (pBVar8 != local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    cVar4 = clock();
    cVar5 = clock();
    if (local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pBVar7 = local_d8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pBVar8 = local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data
               ._M_start;
      pBVar9 = local_f8.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
               _M_start;
      do {
        BN::PowModBarrett(&local_78,pBVar8,pBVar7,pBVar9);
        if (local_78.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.ba.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        pBVar8 = pBVar8 + 1;
        pBVar7 = pBVar7 + 1;
        pBVar9 = pBVar9 + 1;
      } while (pBVar8 != local_138.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    cVar6 = clock();
    printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",
           SUB84((double)((float)(ulong)(cVar4 - cVar3) / ((float)test * 1000.0)),0),
           (double)((float)(ulong)(cVar6 - cVar5) / ((float)test * 1000.0)),local_118,
           (ulong)(uint)((int)local_118 * 8));
    std::vector<BN,_std::allocator<BN>_>::~vector(&local_f8);
    std::vector<BN,_std::allocator<BN>_>::~vector(&local_d8);
    std::vector<BN,_std::allocator<BN>_>::~vector(&local_138);
    return;
  }
  byteCount = (ulong)(uint)base;
LAB_0010989c:
  BN::makeRandom(&local_110,byteCount);
  std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_138,&local_110);
  if (local_110.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  BN::makeRandom(&local_110,byteCount);
  std::vector<BN,_std::allocator<BN>_>::emplace_back<BN>(&local_d8,&local_110);
  if (local_110.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  BN::makeRandom(&local_110,byteCount);
LAB_001098f5:
  bVar1 = BN::is0(&local_110);
  if (!bVar1) {
    BN::BN(&local_90,&local_110);
    BN::BN(&local_a8,0x10000);
    gcdBinary(&local_c0,&local_90,&local_a8);
    BN::BN(&local_48,1);
    bVar1 = BN::operator!=(&local_c0,&local_48);
    if (local_48.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_a8.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.ba.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (!bVar1) goto LAB_001099db;
  }
  BN::makeRandom(&local_c0,byteCount);
  BN::operator=(&local_110,&local_c0);
  if (local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  goto LAB_001098f5;
LAB_001099db:
  std::vector<BN,_std::allocator<BN>_>::push_back(&local_f8,&local_110);
  if (local_110.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar2 = iVar2 + 1;
  if (iVar2 == test) goto LAB_00109a0b;
  goto LAB_0010989c;
}

Assistant:

void modtest(int base,int test) {
    uint64_t t;
    vector <BN> g;
    vector <BN> exp;
    vector <BN> mod;


    for(int i=0;i<test;i++) {
        g.push_back(BN::makeRandom(base));
        exp.push_back(BN::makeRandom(base));
        BN m(BN::makeRandom(base));
        while (m.is0() || (gcdBinary(m, (BN)bsize) != (BN) 1))
            m = BN::makeRandom(base);
        mod.push_back( m );
    }

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowMod(*j, *k);
    float t1 = clock() - t;

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowModBarrett(*j, *k);
    float t2 = clock() - t;

    float diviser = 1000.0 * test;
    t1 /= diviser;
    t2 /= diviser;

    printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",base,(int)(base*8),test, t1, t2);
}